

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiFeatureInfo.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::CheckEnumerateDeviceExtensionPropertiesIncompleteResult::
~CheckEnumerateDeviceExtensionPropertiesIncompleteResult
          (CheckEnumerateDeviceExtensionPropertiesIncompleteResult *this)

{
  ~CheckEnumerateDeviceExtensionPropertiesIncompleteResult(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

CheckEnumerateDeviceExtensionPropertiesIncompleteResult (std::string layerName = std::string()) : m_layerName(layerName) {}